

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

ostream * operator<<(ostream *os,uint160 *num)

{
  long in_FS_OFFSET;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<160u>::ToString_abi_cxx11_(&local_38,num);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const uint160& num)
{
    os << num.ToString();
    return os;
}